

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void encode_field(upb_encstate *e,upb_Message *msg,upb_MiniTableSubInternal *subs,
                 upb_MiniTableField *field)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  upb_MiniTable *puVar5;
  upb_Map *map;
  upb_Array *arr;
  long *plVar6;
  long lVar7;
  upb_encstate *e_00;
  _Bool _Var8;
  upb_StringView *strp;
  size_t sVar9;
  long lVar10;
  uint32_t tag;
  size_t __n;
  char *pcVar11;
  uint uVar12;
  uint *__src;
  ulong uVar13;
  char *val_00;
  ulong uVar14;
  uint uVar15;
  size_t sStack_b0;
  intptr_t iter_1;
  upb_encstate *local_90;
  upb_StringView strkey;
  upb_value val;
  upb_MapEntry ent;
  intptr_t iter;
  long local_38;
  
  bVar2 = field->mode_dont_copy_me__upb_internal_use_only;
  switch(bVar2 & 3) {
  case 0:
    puVar5 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    if (puVar5->field_count_dont_copy_me__upb_internal_use_only != 2) {
      __assert_fail("upb_MiniTable_FieldCount(layout) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/encode.c"
                    ,0x1bc,
                    "void encode_map(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                   );
    }
    map = *(upb_Map **)
           ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
    if (map == (upb_Map *)0x0) {
      return;
    }
    sVar9 = upb_Map_Size(map);
    if (sVar9 == 0) {
      return;
    }
    if ((e->options & 1) == 0) {
      if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
        iter = -1;
        while (_Var8 = upb_strtable_next2(&(map->t).strtable,&strkey,&val,&iter), _Var8) {
          if ((long)map->key_size == 0) {
            ent.k.str.data = strkey.data;
          }
          else {
            memcpy(&ent.k,strkey.data,(long)map->key_size);
          }
          iter_1 = val.val;
          if ((long)map->val_size == 0) {
            ent.v.str.data = (char *)*(undefined8 *)val.val;
            ent.v.str.size = *(size_t *)(val.val + 8);
          }
          else {
            memcpy(&ent.v,&iter_1,(long)map->val_size);
          }
          encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar5,&ent);
        }
        return;
      }
      iter_1 = -1;
      iter = 0;
      while (_Var8 = upb_inttable_next(&(map->t).inttable,(uintptr_t *)&iter,&val,&iter_1), _Var8) {
        memcpy(&ent.k,&iter,(long)map->key_size);
        strkey.data = (char *)val.val;
        if ((long)map->val_size == 0) {
          ent.v.str.data = (char *)*(undefined8 *)val.val;
          ent.v.str.size = *(size_t *)(val.val + 8);
        }
        else {
          memcpy(&ent.v,&strkey,(long)map->val_size);
        }
        encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar5,&ent);
      }
      return;
    }
    if (map->is_strtable_dont_copy_me__upb_internal_use_only == false) {
      for (pcVar11 = (char *)0x0; pcVar11 < (char *)(ulong)(map->t).inttable.array_size;
          pcVar11 = pcVar11 + 1) {
        if (((map->t).inttable.presence_mask[(ulong)pcVar11 >> 3] >> ((uint)pcVar11 & 7) & 1) != 0)
        {
          strkey.data = (char *)(map->t).inttable.array[(long)pcVar11].val;
          ent.k.str.data = pcVar11;
          if ((long)map->val_size == 0) {
            ent.v.str.data = (char *)*(undefined8 *)strkey.data;
            ent.v.str.size = *(undefined8 *)(strkey.data + 8);
          }
          else {
            memcpy(&ent.v,&strkey,(long)map->val_size);
          }
          encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar5,&ent);
        }
      }
    }
    _upb_mapsorter_pushmap
              (&e->sorter,
               (uint)puVar5->fields_dont_copy_me__upb_internal_use_only->
                     descriptortype_dont_copy_me__upb_internal_use_only,map,
               (_upb_sortedmap *)&strkey);
    do {
      lVar10 = (long)strkey.data._4_4_;
      if (strkey.data._4_4_ == (int)strkey.size) {
        (e->sorter).size = (int)strkey.data;
        return;
      }
      strkey.data = (char *)CONCAT44(strkey.data._4_4_ + 1,(int)strkey.data);
      plVar6 = (long *)(e->sorter).entries[lVar10];
      if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
        __src = (uint *)plVar6[1] + 1;
        __n = (size_t)map->key_size;
        if (__n != 0) goto LAB_002bc8b7;
        ent.k.str.size = (size_t)*(uint *)plVar6[1];
        ent.k.str.data = (char *)__src;
      }
      else {
        iter_1 = plVar6[1];
        __n = (size_t)map->key_size;
        __src = (uint *)&iter_1;
LAB_002bc8b7:
        memcpy(&ent.k,__src,__n);
      }
      iter_1 = *plVar6;
      if ((long)map->val_size == 0) {
        ent.v.str.data = (char *)*(undefined8 *)iter_1;
        ent.v.str.size = *(size_t *)(iter_1 + 8);
      }
      else {
        memcpy(&ent.v,&iter_1,(long)map->val_size);
      }
      encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar5,&ent);
    } while( true );
  case 1:
    arr = *(upb_Array **)
           ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
    if (arr == (upb_Array *)0x0) {
      return;
    }
    sVar9 = arr->size_dont_copy_me__upb_internal_use_only;
    if (sVar9 == 0) {
      return;
    }
    break;
  case 2:
    encode_scalar(e,(void *)((long)&msg->field_0 +
                            (ulong)field->offset_dont_copy_me__upb_internal_use_only),subs,field);
    return;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/encode.c"
                  ,0x224,
                  "void encode_field(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                 );
  }
  local_38 = (long)e->ptr - (long)e->limit;
  local_90 = e;
  switch(field->descriptortype_dont_copy_me__upb_internal_use_only) {
  case '\x01':
  case '\x06':
  case '\x10':
    tag = 0;
    if ((bVar2 & 4) == 0) {
      tag = field->number_dont_copy_me__upb_internal_use_only * 8 + 1;
    }
    sStack_b0 = 8;
    goto LAB_002bca50;
  case '\x02':
  case '\a':
  case '\x0f':
    tag = 0;
    if ((bVar2 & 4) == 0) {
      tag = field->number_dont_copy_me__upb_internal_use_only * 8 + 5;
    }
    sStack_b0 = 4;
LAB_002bca50:
    encode_fixedarray(e,arr,sStack_b0,tag);
    break;
  case '\x03':
  case '\x04':
    uVar14 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar15 = 0;
    if ((bVar2 & 4) == 0) {
      uVar15 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar10 = sVar9 << 3;
    do {
      uVar13 = *(ulong *)(((uVar14 & 0xfffffffffffffff8) - 8) + lVar10);
      if ((uVar13 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
        e->ptr = pcVar11 + -1;
        pcVar11[-1] = (char)uVar13;
      }
      else {
        encode_longvarint(e,uVar13);
      }
      if ((ulong)uVar15 != 0) {
        if ((uVar15 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
          e->ptr = pcVar11 + -1;
          pcVar11[-1] = (char)uVar15;
        }
        else {
          encode_longvarint(e,(ulong)uVar15);
        }
      }
      lVar10 = lVar10 + -8;
    } while (lVar10 != 0);
    break;
  case '\x05':
  case '\x0e':
    uVar14 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar15 = 0;
    if ((bVar2 & 4) == 0) {
      uVar15 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar10 = sVar9 << 2;
    do {
      iVar4 = *(int *)(((uVar14 & 0xfffffffffffffff8) - 4) + lVar10);
      if (((ulong)(long)iVar4 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
        e->ptr = pcVar11 + -1;
        pcVar11[-1] = (char)iVar4;
      }
      else {
        encode_longvarint(e,(long)iVar4);
      }
      if ((ulong)uVar15 != 0) {
        if ((uVar15 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
          e->ptr = pcVar11 + -1;
          pcVar11[-1] = (char)uVar15;
        }
        else {
          encode_longvarint(e,(ulong)uVar15);
        }
      }
      lVar10 = lVar10 + -4;
    } while (lVar10 != 0);
    break;
  case '\b':
    uVar14 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar15 = 0;
    if ((bVar2 & 4) == 0) {
      uVar15 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    do {
      bVar3 = *(byte *)(((uVar14 & 0xfffffffffffffff8) - 1) + sVar9);
      pcVar11 = e->ptr;
      if (pcVar11 == e->buf) {
        encode_longvarint(e,(ulong)bVar3);
      }
      else {
        e->ptr = pcVar11 + -1;
        pcVar11[-1] = bVar3;
      }
      if ((ulong)uVar15 != 0) {
        if ((uVar15 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
          e->ptr = pcVar11 + -1;
          pcVar11[-1] = (char)uVar15;
        }
        else {
          encode_longvarint(e,(ulong)uVar15);
        }
      }
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
    break;
  case '\t':
  case '\f':
    uVar14 = arr->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8;
    lVar10 = sVar9 << 4;
    do {
      encode_bytes(e,*(void **)((uVar14 - 0x10) + lVar10),*(size_t *)((uVar14 - 8) + lVar10));
      uVar13 = *(ulong *)((uVar14 - 8) + lVar10);
      if ((uVar13 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
        e->ptr = pcVar11 + -1;
        pcVar11[-1] = (char)uVar13;
      }
      else {
        encode_longvarint(e,uVar13);
      }
      encode_tag(e,field->number_dont_copy_me__upb_internal_use_only,'\x02');
      lVar10 = lVar10 + -0x10;
    } while (lVar10 != 0);
    return;
  case '\n':
    uVar14 = arr->data_dont_copy_me__upb_internal_use_only;
    puVar5 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      lVar10 = sVar9 << 3;
      do {
        encode_tag(e,field->number_dont_copy_me__upb_internal_use_only,'\x04');
        encode_TaggedMessagePtr
                  (e,*(upb_TaggedMessagePtr *)(((uVar14 & 0xfffffffffffffff8) - 8) + lVar10),puVar5,
                   (size_t *)&ent);
        encode_tag(e,field->number_dont_copy_me__upb_internal_use_only,'\x03');
        lVar10 = lVar10 + -8;
      } while (lVar10 != 0);
      e->depth = e->depth + 1;
      return;
    }
    encode_err(e,kUpb_EncodeStatus_MaxDepthExceeded);
  case '\v':
    uVar14 = arr->data_dont_copy_me__upb_internal_use_only;
    puVar5 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      lVar10 = sVar9 << 3;
      do {
        encode_TaggedMessagePtr
                  (e,*(upb_TaggedMessagePtr *)(((uVar14 & 0xfffffffffffffff8) - 8) + lVar10),puVar5,
                   (size_t *)&ent);
        if (((ulong)ent.message.field_0 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
          e->ptr = pcVar11 + -1;
          pcVar11[-1] = ent.message.field_0._0_1_;
        }
        else {
          encode_longvarint(e,(uint64_t)ent.message.field_0);
        }
        encode_tag(e,field->number_dont_copy_me__upb_internal_use_only,'\x02');
        lVar10 = lVar10 + -8;
      } while (lVar10 != 0);
      e->depth = e->depth + 1;
      return;
    }
    encode_err(e,kUpb_EncodeStatus_MaxDepthExceeded);
  case '\r':
    uVar14 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar15 = 0;
    if ((bVar2 & 4) == 0) {
      uVar15 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar10 = sVar9 << 2;
    do {
      uVar12 = *(uint *)(((uVar14 & 0xfffffffffffffff8) - 4) + lVar10);
      if (((ulong)uVar12 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
        e->ptr = pcVar11 + -1;
        pcVar11[-1] = (char)uVar12;
      }
      else {
        encode_longvarint(e,(ulong)uVar12);
      }
      if ((ulong)uVar15 != 0) {
        if ((uVar15 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
          e->ptr = pcVar11 + -1;
          pcVar11[-1] = (char)uVar15;
        }
        else {
          encode_longvarint(e,(ulong)uVar15);
        }
      }
      lVar10 = lVar10 + -4;
    } while (lVar10 != 0);
    break;
  case '\x11':
    uVar14 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar15 = 0;
    if ((bVar2 & 4) == 0) {
      uVar15 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar10 = sVar9 << 2;
    do {
      iVar4 = *(int *)(((uVar14 & 0xfffffffffffffff8) - 4) + lVar10);
      uVar12 = iVar4 >> 0x1f ^ iVar4 * 2;
      if ((uVar12 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
        e->ptr = pcVar11 + -1;
        pcVar11[-1] = (char)uVar12;
      }
      else {
        encode_longvarint(e,(ulong)uVar12);
      }
      if ((ulong)uVar15 != 0) {
        if ((uVar15 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
          e->ptr = pcVar11 + -1;
          pcVar11[-1] = (char)uVar15;
        }
        else {
          encode_longvarint(e,(ulong)uVar15);
        }
      }
      lVar10 = lVar10 + -4;
    } while (lVar10 != 0);
    break;
  case '\x12':
    uVar14 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar15 = 0;
    if ((bVar2 & 4) == 0) {
      uVar15 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar10 = sVar9 << 3;
    do {
      lVar7 = *(long *)(((uVar14 & 0xfffffffffffffff8) - 8) + lVar10);
      uVar13 = lVar7 >> 0x3f ^ lVar7 * 2;
      if ((uVar13 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
        e->ptr = pcVar11 + -1;
        pcVar11[-1] = (char)uVar13;
      }
      else {
        encode_longvarint(e,uVar13);
      }
      if ((ulong)uVar15 != 0) {
        if ((uVar15 < 0x80) && (pcVar11 = e->ptr, pcVar11 != e->buf)) {
          e->ptr = pcVar11 + -1;
          pcVar11[-1] = (char)uVar15;
        }
        else {
          encode_longvarint(e,(ulong)uVar15);
        }
      }
      lVar10 = lVar10 + -8;
    } while (lVar10 != 0);
  }
  e_00 = local_90;
  if ((bVar2 & 4) == 0) {
    return;
  }
  pcVar11 = local_90->ptr;
  val_00 = local_90->limit + (local_38 - (long)pcVar11);
  if ((val_00 < (char *)0x80) && (pcVar11 != local_90->buf)) {
    local_90->ptr = pcVar11 + -1;
    pcVar11[-1] = (char)val_00;
  }
  else {
    encode_longvarint(local_90,(uint64_t)val_00);
  }
  encode_tag(e_00,field->number_dont_copy_me__upb_internal_use_only,'\x02');
  return;
}

Assistant:

static void encode_field(upb_encstate* e, const upb_Message* msg,
                         const upb_MiniTableSubInternal* subs,
                         const upb_MiniTableField* field) {
  switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(field)) {
    case kUpb_FieldMode_Array:
      encode_array(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Map:
      encode_map(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Scalar:
      encode_scalar(e, UPB_PTR_AT(msg, field->UPB_PRIVATE(offset), void), subs,
                    field);
      break;
    default:
      UPB_UNREACHABLE();
  }
}